

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgLongPoll.cpp
# Opt level: O2

void __thiscall TgBot::TgLongPoll::start(TgLongPoll *this)

{
  int iVar1;
  EventHandler *this_00;
  __shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  vector<std::shared_ptr<TgBot::Update>,_std::allocator<std::shared_ptr<TgBot::Update>_>_> updates;
  __shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2> _Stack_58;
  vector<std::shared_ptr<TgBot::Update>,_std::allocator<std::shared_ptr<TgBot::Update>_>_> local_48;
  
  Api::getUpdates(&local_48,this->_api,this->_lastUpdateId,this->_limit,this->_timeout,
                  &this->_allowupdates);
  for (p_Var2 = &(local_48.
                  super__Vector_base<std::shared_ptr<TgBot::Update>,_std::allocator<std::shared_ptr<TgBot::Update>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>;
      p_Var2 != &(local_48.
                  super__Vector_base<std::shared_ptr<TgBot::Update>,_std::allocator<std::shared_ptr<TgBot::Update>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                 super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>; p_Var2 = p_Var2 + 1)
  {
    iVar1 = p_Var2->_M_ptr->updateId;
    if (this->_lastUpdateId <= iVar1) {
      this->_lastUpdateId = iVar1 + 1;
    }
    this_00 = this->_eventHandler;
    std::__shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&_Stack_58,p_Var2);
    EventHandler::handleUpdate(this_00,(Ptr *)&_Stack_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_58._M_refcount);
  }
  std::vector<std::shared_ptr<TgBot::Update>,_std::allocator<std::shared_ptr<TgBot::Update>_>_>::
  ~vector(&local_48);
  return;
}

Assistant:

void TgLongPoll::start() {
    std::vector<Update::Ptr> updates = _api->getUpdates(_lastUpdateId, _limit, _timeout, _allowupdates);
    for (Update::Ptr& item : updates) {
        if (item->updateId >= _lastUpdateId) {
            _lastUpdateId = item->updateId + 1;
        }
        _eventHandler->handleUpdate(item);
    }
}